

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::reset(Tokenizer *this)

{
  Tokenizer *this_local;
  
  this->state = st_before_token;
  this->type = tt_bad;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::operator=((string *)&this->error_message,"");
  this->before_token = true;
  this->in_token = false;
  this->char_to_unread = '\0';
  this->inline_image_bytes = 0;
  this->string_depth = 0;
  this->bad = false;
  return;
}

Assistant:

void
Tokenizer::reset()
{
    state = st_before_token;
    type = tt::tt_bad;
    val.clear();
    raw_val.clear();
    error_message = "";
    before_token = true;
    in_token = false;
    char_to_unread = '\0';
    inline_image_bytes = 0;
    string_depth = 0;
    bad = false;
}